

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Market.cpp
# Opt level: O3

bool __thiscall Market::insert(Market *this,Order *order)

{
  pair<const_double,_Order> local_d0;
  
  if (order->m_side == buy) {
    local_d0.first = order->m_price;
    Order::Order(&local_d0.second,order);
    std::
    _Rb_tree<double,std::pair<double_const,Order>,std::_Select1st<std::pair<double_const,Order>>,std::greater<double>,std::allocator<std::pair<double_const,Order>>>
    ::_M_insert_equal<std::pair<double_const,Order>>
              ((_Rb_tree<double,std::pair<double_const,Order>,std::_Select1st<std::pair<double_const,Order>>,std::greater<double>,std::allocator<std::pair<double_const,Order>>>
                *)&this->m_bidOrders,&local_d0);
  }
  else {
    local_d0.first = order->m_price;
    Order::Order(&local_d0.second,order);
    std::
    _Rb_tree<double,std::pair<double_const,Order>,std::_Select1st<std::pair<double_const,Order>>,std::less<double>,std::allocator<std::pair<double_const,Order>>>
    ::_M_insert_equal<std::pair<double_const,Order>>
              ((_Rb_tree<double,std::pair<double_const,Order>,std::_Select1st<std::pair<double_const,Order>>,std::less<double>,std::allocator<std::pair<double_const,Order>>>
                *)&this->m_askOrders,&local_d0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0.second.m_target._M_dataplus._M_p != &local_d0.second.m_target.field_2) {
    operator_delete(local_d0.second.m_target._M_dataplus._M_p,
                    local_d0.second.m_target.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0.second.m_owner._M_dataplus._M_p != &local_d0.second.m_owner.field_2) {
    operator_delete(local_d0.second.m_owner._M_dataplus._M_p,
                    local_d0.second.m_owner.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0.second.m_symbol._M_dataplus._M_p != &local_d0.second.m_symbol.field_2) {
    operator_delete(local_d0.second.m_symbol._M_dataplus._M_p,
                    local_d0.second.m_symbol.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0.second.m_clientId._M_dataplus._M_p != &local_d0.second.m_clientId.field_2) {
    operator_delete(local_d0.second.m_clientId._M_dataplus._M_p,
                    local_d0.second.m_clientId.field_2._M_allocated_capacity + 1);
  }
  return true;
}

Assistant:

bool Market::insert(const Order &order) {
  if (order.getSide() == Order::buy) {
    m_bidOrders.insert(BidOrders::value_type(order.getPrice(), order));
  } else {
    m_askOrders.insert(AskOrders::value_type(order.getPrice(), order));
  }
  return true;
}